

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall HdmiCecSimulationDataGenerator::GenStartSeq(HdmiCecSimulationDataGenerator *this)

{
  BitState BVar1;
  
  if (this->mErrorType == ERR_NOSTARTSEQ) {
    this->mErrorType = ERR_NOERROR;
    return;
  }
  BVar1 = (int)this + 0x10;
  SimulationChannelDescriptor::TransitionIfNeeded(BVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(0.0037000000476837156);
  SimulationChannelDescriptor::Advance(BVar1);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(0.0007999999523162842);
  SimulationChannelDescriptor::Advance(BVar1);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::GenStartSeq()
{
    if( mErrorType == ERR_NOSTARTSEQ )
    {
        mErrorType = ERR_NOERROR;
        return;
    }

    // The bus must be in high
    mCecSimulationData.TransitionIfNeeded( BIT_HIGH );

    // Timing values from CEC 1.3a section 5.2.1 "Start Bit Timing"
    mCecSimulationData.Transition(); // HIGH to LOW
    Advance( HdmiCec::Tim_Start_A );

    mCecSimulationData.Transition(); // LOW to HIGH
    Advance( HdmiCec::Tim_Start_B - HdmiCec::Tim_Start_A );
}